

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O0

int lws_plat_ifconfig(int fd,lws_dhcpc_ifstate_t *is)

{
  int iVar1;
  uint32_t uVar2;
  uint *puVar3;
  undefined2 local_c8;
  undefined2 uStack_c6;
  uint32_t uStack_c4;
  sockaddr_in sin;
  ifreq ifr;
  rtentry route;
  lws_dhcpc_ifstate_t *is_local;
  int fd_local;
  
  memset(sin.sin_zero,0,0x28);
  memset((void *)((long)&ifr.ifr_ifru + 0x10),0,0x78);
  lws_strncpy((char *)sin.sin_zero,is->ifname,0x10);
  lws_plat_if_up(is->ifname,fd,0);
  ifr.ifr_ifrn._8_8_ = *(undefined8 *)is->sa46;
  ifr.ifr_ifru.ifru_map.mem_start = *(unsigned_long *)((long)is->sa46 + 8);
  iVar1 = ioctl(fd,0x8916,sin.sin_zero);
  if (iVar1 < 0) {
    _lws_log(1,"%s: SIOCSIFADDR fail\n","lws_plat_ifconfig");
    return 1;
  }
  if (is->sa46[0].sa4.sin_family == 2) {
    memset(&local_c8,0,0x10);
    local_c8 = 2;
    uStack_c4 = is->nums[0];
    ifr.ifr_ifrn._8_8_ = CONCAT44(uStack_c4,CONCAT22(uStack_c6,2));
    ifr.ifr_ifru._0_2_ = sin.sin_family;
    ifr.ifr_ifru._2_2_ = sin.sin_port;
    ifr.ifr_ifru._4_4_ = sin.sin_addr.s_addr;
    iVar1 = ioctl(fd,0x891c,sin.sin_zero);
    if (iVar1 < 0) {
      _lws_log(1,"%s: SIOCSIFNETMASK fail\n","lws_plat_ifconfig");
      return 1;
    }
    lws_plat_if_up(is->ifname,fd,1);
    uStack_c4 = 0;
    iVar1 = ioctl(fd,0x890b,(undefined1 *)((long)&ifr.ifr_ifru + 0x10));
    if (iVar1 < 0) {
      uVar2 = htonl(*(uint32_t *)((long)is->sa46 + 0x54));
      puVar3 = (uint *)__errno_location();
      _lws_log(1,"%s: SIOCADDRT 0x%x fail: %d\n","lws_plat_ifconfig",(ulong)uVar2,(ulong)*puVar3);
      return 1;
    }
  }
  else {
    lws_plat_if_up(is->ifname,fd,1);
  }
  return 0;
}

Assistant:

int
lws_plat_ifconfig(int fd, lws_dhcpc_ifstate_t *is)
{
#if defined(__linux__)
	struct rtentry route;
	struct ifreq ifr;

	memset(&ifr, 0, sizeof(ifr));
	memset(&route, 0, sizeof(route));

	lws_strncpy(ifr.ifr_name, is->ifname, IFNAMSIZ);

	lws_plat_if_up(is->ifname, fd, 0);

	memcpy(&ifr.ifr_addr, &is->sa46[LWSDH_SA46_IP], sizeof(struct sockaddr));
	if (ioctl(fd, SIOCSIFADDR, &ifr) < 0) {
		lwsl_err("%s: SIOCSIFADDR fail\n", __func__);
		return 1;
	}

	if (is->sa46[LWSDH_SA46_IP].sa4.sin_family == AF_INET) {
		struct sockaddr_in sin;

		memset(&sin, 0, sizeof(sin));
		sin.sin_family = AF_INET;
		sin.sin_addr.s_addr = *(uint32_t *)&is->nums[LWSDH_IPV4_SUBNET_MASK];
		memcpy(&ifr.ifr_addr, &sin, sizeof(struct sockaddr));
		if (ioctl(fd, SIOCSIFNETMASK, &ifr) < 0) {
			lwsl_err("%s: SIOCSIFNETMASK fail\n", __func__);
			return 1;
		}

		lws_plat_if_up(is->ifname, fd, 1);

		memcpy(&route.rt_gateway,
		       &is->sa46[LWSDH_SA46_IPV4_ROUTER].sa4,
		       sizeof(struct sockaddr));

		sin.sin_addr.s_addr = 0;
		memcpy(&route.rt_dst, &sin, sizeof(struct sockaddr));
		memcpy(&route.rt_genmask, &sin, sizeof(struct sockaddr));

		route.rt_flags = RTF_UP | RTF_GATEWAY;
		route.rt_metric = 100;
		route.rt_dev = (char *)is->ifname;

		if (ioctl(fd, SIOCADDRT, &route) < 0) {
			lwsl_err("%s: SIOCADDRT 0x%x fail: %d\n", __func__,
				(unsigned int)htonl(*(uint32_t *)&is->
					sa46[LWSDH_SA46_IPV4_ROUTER].
						sa4.sin_addr.s_addr), LWS_ERRNO);
			return 1;
		}
	} else
		lws_plat_if_up(is->ifname, fd, 1);

	return 0;
#else
	lwsl_err("%s: UNIMPLEMENTED on this platform\n", __func__);

	return -1;
#endif
}